

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_harmonic_symplectic.h
# Opt level: O1

void PrintHelp(void)

{
  fwrite("ark_harmonic_symplectic: an ARKODE example demonstrating the SPRKStep time-stepping module solving a simple harmonic oscillator\n"
         ,0x80,1,_stderr);
  fwrite("  --order <int>               the order of the method to use (default 4)\n",0x49,1,_stderr
        );
  fwrite("  --dt <Real>                 the fixed-time step size to use (default 0.01)\n",0x4d,1,
         _stderr);
  fwrite("  --nout <int>                the number of output times (default 100)\n",0x47,1,_stderr);
  fwrite("  --use-compensated-sums      turns on compensated summation in ARKODE where applicable\n"
         ,0x58,1,_stderr);
  fwrite("  --disable-tstop             turns off tstop mode\n",0x33,1,_stderr);
  return;
}

Assistant:

static void PrintHelp(void)
{
  fprintf(stderr, "ark_harmonic_symplectic: an ARKODE example demonstrating "
                  "the SPRKStep time-stepping module solving a simple harmonic "
                  "oscillator\n");
  /* clang-format off */
  fprintf(stderr, "  --order <int>               the order of the method to use (default 4)\n");
  fprintf(stderr, "  --dt <Real>                 the fixed-time step size to use (default 0.01)\n");
  fprintf(stderr, "  --nout <int>                the number of output times (default 100)\n");
  fprintf(stderr, "  --use-compensated-sums      turns on compensated summation in ARKODE where applicable\n");
  fprintf(stderr, "  --disable-tstop             turns off tstop mode\n");
  /* clang-format on */
}